

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KFilter.cpp
# Opt level: O3

void __thiscall KFilter::KFilter(KFilter *this,int state_dimension,int measurement_dimension)

{
  char *__function;
  ActualDstType actualDst;
  ActualDstType actualDst_2;
  long size;
  ActualDstType actualDst_1;
  long lVar1;
  ActualDstType actualDst_4;
  ActualDstType actualDst_3;
  assign_op<double,_double> local_59;
  CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_58;
  MatrixXd *local_40;
  MatrixXd *local_38;
  
  local_38 = &this->H_;
  local_40 = &this->R_;
  memset(this,0,0x88);
  this->measurement_dimension_ = measurement_dimension;
  this->state_dimension_ = state_dimension;
  if (state_dimension < 0) {
    __function = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
    ;
  }
  else {
    size = (long)state_dimension;
    if (state_dimension != 0) {
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                ((DenseStorage<double,__1,__1,_1,_0> *)&this->x_,size,size,1);
      if ((this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != size) {
        __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
                     );
      }
      memset((this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data,0,size * 8);
    }
    local_58.m_rows.m_value = size;
    local_58.m_cols.m_value = size;
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<double,double>>
              (&this->F_,&local_58,&local_59);
    local_58.m_rows.m_value = size;
    local_58.m_cols.m_value = size;
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<double,double>>
              (&this->P_,&local_58,&local_59);
    local_58.m_rows.m_value = size;
    local_58.m_cols.m_value = size;
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<double,double>>
              (&this->Q_,&local_58,&local_59);
    lVar1 = (long)measurement_dimension;
    local_58.m_rows.m_value = size;
    if (-1 < (state_dimension | measurement_dimension)) {
      local_58.m_cols.m_value = lVar1;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<double,double>>
                (local_38,&local_58,&local_59);
      local_58.m_rows.m_value = lVar1;
      if (-1 < measurement_dimension) {
        local_58.m_cols.m_value = lVar1;
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<double,double>>
                  (local_40,&local_58,&local_59);
        return;
      }
    }
    __function = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_identity_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
    ;
    local_58.m_cols.m_value = lVar1;
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,__function);
}

Assistant:

KFilter::KFilter(int state_dimension, int measurement_dimension) : 
    state_dimension_(state_dimension), 
    measurement_dimension_(measurement_dimension)
{
    // Initialize all matrices to correct size and default values
    // We'll directly set since we know these dimensions are valid
    x_ = VectorXd::Zero(state_dimension);
    F_ = MatrixXd::Identity(state_dimension, state_dimension);
    P_ = MatrixXd::Identity(state_dimension, state_dimension);
    Q_ = MatrixXd::Identity(state_dimension, state_dimension);
    H_ = MatrixXd::Identity(state_dimension, measurement_dimension);
    R_ = MatrixXd::Identity(measurement_dimension, measurement_dimension);
}